

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_Diablo3.cpp
# Opt level: O1

int RootHandler_CreateDiablo3(TCascStorage *hs,LPBYTE pbRootFile,DWORD cbRootFile)

{
  int iVar1;
  LPBYTE pBVar2;
  TDiabloRoot *this;
  int iVar3;
  DIABLO3_DIRECTORY RootDirectory;
  DIABLO3_DIRECTORY DStack_58;
  
  pBVar2 = TDiabloRoot::CaptureDirectoryData(&DStack_58,pbRootFile,cbRootFile);
  if (pBVar2 == (LPBYTE)0x0) {
    iVar3 = 1000;
    this = (TDiabloRoot *)0x0;
  }
  else {
    this = (TDiabloRoot *)operator_new(0x7b8);
    TFileTreeRoot::TFileTreeRoot((TFileTreeRoot *)this,0);
    (this->super_TFileTreeRoot).super_TRootHandler._vptr_TRootHandler =
         (_func_int **)&PTR__TDiabloRoot_0012d520;
    memset(this->RootFolders,0,0x724);
    this->pPackagesMap = (PCASC_MAP)0x0;
    this->pbPackagesDat = (LPBYTE)0x0;
    this->cbPackagesDat = 0;
    iVar1 = TDiabloRoot::Load(this,hs,&DStack_58);
    iVar3 = 0;
    if (iVar1 != 0) {
      (*(this->super_TFileTreeRoot).super_TRootHandler._vptr_TRootHandler[1])(this);
      this = (TDiabloRoot *)0x0;
      iVar3 = iVar1;
    }
  }
  hs->pRootHandler = (TRootHandler *)this;
  return iVar3;
}

Assistant:

int RootHandler_CreateDiablo3(TCascStorage * hs, LPBYTE pbRootFile, DWORD cbRootFile)
{
    TDiabloRoot * pRootHandler = NULL;
    DIABLO3_DIRECTORY RootDirectory;
    int nError = ERROR_BAD_FORMAT;

    // Verify the header of the ROOT file
    if(TDiabloRoot::CaptureDirectoryData(RootDirectory, pbRootFile, cbRootFile) != NULL)
    {
        // Allocate the root handler object
        pRootHandler = new TDiabloRoot();
        if(pRootHandler != NULL)
        {
            // Load the root directory. If load failed, we free the object
            nError = pRootHandler->Load(hs, RootDirectory);
            if(nError != ERROR_SUCCESS)
            {
                delete pRootHandler;
                pRootHandler = NULL;
            }
        }
    }

    // Assign the root directory (or NULL) and return error
    hs->pRootHandler = pRootHandler;
    return nError;
}